

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O2

void __thiscall
test_vector_dense_vector_subtraction_Test::TestBody(test_vector_dense_vector_subtraction_Test *this)

{
  DeathTest *pDVar1;
  pointer pdVar2;
  bool bVar3;
  int iVar4;
  _func_int **pp_Var5;
  DeathTest *pDVar6;
  char *pcVar7;
  double *element;
  pointer pdVar8;
  long lVar9;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  ReturnSentinel gtest_sentinel;
  Vector_Dense<double,_0UL> dynamic_vector_2;
  Vector_Dense<double,_2UL> static_vector_2;
  Vector_Dense<double,_0UL> dynamic_vector_0;
  Vector_Dense<double,_0UL> result_0;
  Vector_Dense<double,_3UL> static_vector_0;
  Vector_Dense<double,_0UL> dynamic_vector_1;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_108;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_d8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c0;
  Vector_Dense<double,_3UL> static_vector_1;
  _Vector_base<double,_std::allocator<double>_> local_90;
  Vector_Dense<double,_3UL> result_3;
  Vector_Dense<double,_3UL> result_2;
  Vector_Dense<double,_3UL> result_1;
  
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0xbff00000000000;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc000000000000000;
  dynamic_vector_1.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3;
  dynamic_vector_1.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&gtest_ar;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            (&dynamic_vector_0,(initializer_list<double> *)&dynamic_vector_1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0xbff00000000000;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc000000000000000;
  static_vector_0.super_array<double,_3UL>._M_elems[1] = 1.48219693752374e-323;
  static_vector_0.super_array<double,_3UL>._M_elems[0] = (double)&gtest_ar;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            (&dynamic_vector_1,(initializer_list<double> *)&static_vector_0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0xc0100000000000;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc014000000000000;
  static_vector_1.super_array<double,_3UL>._M_elems[1] = 1.48219693752374e-323;
  static_vector_1.super_array<double,_3UL>._M_elems[0] = (double)&gtest_ar;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense
            (&static_vector_0,(initializer_list<double> *)&static_vector_1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0xc0100000000000;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc014000000000000;
  result_0.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3;
  result_0.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&gtest_ar;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense
            (&static_vector_1,(initializer_list<double> *)&result_0);
  Disa::operator-(&result_0,&dynamic_vector_0,&dynamic_vector_1);
  Disa::operator-(&result_1,&static_vector_0,&dynamic_vector_1);
  Disa::operator-(&result_2,&dynamic_vector_0,&static_vector_1);
  Disa::operator-(&result_3,&static_vector_0,&static_vector_1);
  pdVar2 = result_0.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar8 = result_0.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start; pdVar8 != pdVar2; pdVar8 = pdVar8 + 1) {
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar,"element","0.0",*pdVar8,0.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&dynamic_vector_2);
      pcVar7 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar7 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&static_vector_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd5,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&static_vector_2,(Message *)&dynamic_vector_2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&static_vector_2);
      if (dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        (**(code **)((long)*dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 8) {
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar,"element","-3.0",
               *(double *)((long)result_1.super_array<double,_3UL>._M_elems + lVar9),-3.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&dynamic_vector_2);
      pcVar7 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar7 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&static_vector_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd6,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&static_vector_2,(Message *)&dynamic_vector_2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&static_vector_2);
      if (dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        (**(code **)((long)*dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 8) {
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar,"element","3.0",
               *(double *)((long)result_2.super_array<double,_3UL>._M_elems + lVar9),3.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&dynamic_vector_2);
      pcVar7 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar7 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&static_vector_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd7,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&static_vector_2,(Message *)&dynamic_vector_2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&static_vector_2);
      if (dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        (**(code **)((long)*dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 8) {
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&gtest_ar,"element","0.0",
               *(double *)((long)result_3.super_array<double,_3UL>._M_elems + lVar9),0.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&dynamic_vector_2);
      pcVar7 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar7 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&static_vector_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                 ,0xd8,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&static_vector_2,(Message *)&dynamic_vector_2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&static_vector_2);
      if (dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        (**(code **)((long)*dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  dynamic_vector_2.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  static_vector_2.super_array<double,_2UL>._M_elems[0] = 0.0;
  static_vector_2.super_array<double,_2UL>._M_elems[1] = 0.0;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("dynamic_vector_0 - dynamic_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdc,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c0);
    pDVar6 = gtest_dt;
    if (!bVar3) goto LAB_0010f7ea;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar4 == 0) {
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*pDVar6->_vptr_DeathTest[1])(pDVar6);
          goto LAB_0010f7ea;
        }
      }
      else if (iVar4 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          Disa::operator-((type *)&local_90,&dynamic_vector_0,&dynamic_vector_2);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var5 = pDVar6->_vptr_DeathTest;
      goto LAB_0010f83b;
    }
  }
  else {
LAB_0010f7ea:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xdc,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (gtest_ar._0_8_ != 0) {
      pp_Var5 = *(_func_int ***)gtest_ar._0_8_;
      pDVar6 = (DeathTest *)gtest_ar._0_8_;
LAB_0010f83b:
      (*pp_Var5[1])(pDVar6);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("static_vector_0 - dynamic_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdd,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_d8);
    pDVar6 = gtest_dt;
    if (!bVar3) goto LAB_0010f935;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar4 == 0) {
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*pDVar6->_vptr_DeathTest[1])(pDVar6);
          goto LAB_0010f935;
        }
      }
      else if (iVar4 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          Disa::operator-((type *)&gtest_ar,&static_vector_0,&dynamic_vector_2);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var5 = pDVar6->_vptr_DeathTest;
      goto LAB_0010f986;
    }
  }
  else {
LAB_0010f935:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xdd,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (gtest_ar._0_8_ != 0) {
      pp_Var5 = *(_func_int ***)gtest_ar._0_8_;
      pDVar6 = (DeathTest *)gtest_ar._0_8_;
LAB_0010f986:
      (*pp_Var5[1])(pDVar6);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("dynamic_vector_0 - static_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xde,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_f0);
    pDVar6 = gtest_dt;
    if (!bVar3) goto LAB_0010fa78;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar4 == 0) {
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*pDVar6->_vptr_DeathTest[1])(pDVar6);
          goto LAB_0010fa78;
        }
      }
      else if (iVar4 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          Disa::operator-(&dynamic_vector_0,&static_vector_2);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      pp_Var5 = pDVar6->_vptr_DeathTest;
      goto LAB_0010fac9;
    }
  }
  else {
LAB_0010fa78:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xde,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (gtest_ar._0_8_ != 0) {
      pp_Var5 = *(_func_int ***)gtest_ar._0_8_;
      pDVar6 = (DeathTest *)gtest_ar._0_8_;
LAB_0010fac9:
      (*pp_Var5[1])(pDVar6);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    bVar3 = testing::internal::DeathTest::Create
                      ("static_vector_0 - static_vector_2",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_108,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0xdf,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_108);
    pDVar6 = gtest_dt;
    if (!bVar3) goto LAB_0010fbc3;
    if (gtest_dt == (DeathTest *)0x0) goto LAB_0010fc17;
    iVar4 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
    if (iVar4 == 0) {
      iVar4 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
      bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
      iVar4 = (*gtest_dt->_vptr_DeathTest[4])(gtest_dt,(ulong)bVar3);
      if ((char)iVar4 == '\0') {
        (*pDVar6->_vptr_DeathTest[1])(pDVar6);
        goto LAB_0010fbc3;
      }
    }
    else if (iVar4 == 1) {
      gtest_sentinel.test_ = gtest_dt;
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        Disa::operator-((type *)&gtest_ar,&static_vector_0,&static_vector_2);
      }
      (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
    }
    pp_Var5 = pDVar6->_vptr_DeathTest;
  }
  else {
LAB_0010fbc3:
    testing::Message::Message((Message *)&gtest_ar);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xdf,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if (gtest_ar._0_8_ == 0) goto LAB_0010fc17;
    pp_Var5 = *(_func_int ***)gtest_ar._0_8_;
    pDVar6 = (DeathTest *)gtest_ar._0_8_;
  }
  (*pp_Var5[1])(pDVar6);
LAB_0010fc17:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&dynamic_vector_2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&result_0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&dynamic_vector_1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&dynamic_vector_0);
  return;
}

Assistant:

TEST(test_vector_dense, vector_subtraction) {
  Vector_Dense<Scalar, 0> dynamic_vector_0 = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 0> dynamic_vector_1 = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 3> static_vector_0 = {-4.0, -5.0, -6.0};
  Vector_Dense<Scalar, 3> static_vector_1 = {-4.0, -5.0, -6.0};

  Vector_Dense<Scalar, 0> result_0 = dynamic_vector_0 - dynamic_vector_1;
  Vector_Dense<Scalar, 3> result_1 = static_vector_0 - dynamic_vector_1;
  Vector_Dense<Scalar, 3> result_2 = dynamic_vector_0 - static_vector_1;
  Vector_Dense<Scalar, 3> result_3 = static_vector_0 - static_vector_1;
  FOR_EACH(element, result_0) EXPECT_DOUBLE_EQ(element, 0.0);
  FOR_EACH(element, result_1) EXPECT_DOUBLE_EQ(element, -3.0);
  FOR_EACH(element, result_2) EXPECT_DOUBLE_EQ(element, 3.0);
  FOR_EACH(element, result_3) EXPECT_DOUBLE_EQ(element, 0.0);

  Vector_Dense<Scalar, 0> dynamic_vector_2;
  Vector_Dense<Scalar, 2> static_vector_2;
  EXPECT_DEATH(dynamic_vector_0 - dynamic_vector_2, "./*");
  EXPECT_DEATH(static_vector_0 - dynamic_vector_2, "./*");
  EXPECT_DEATH(dynamic_vector_0 - static_vector_2, "./*");
  EXPECT_DEATH(static_vector_0 - static_vector_2, "./*");
}